

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForEnum
          (Generator *this,EnumDescriptor *enum_descriptor)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  string value_options;
  string enum_options;
  string descriptor_name;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_50,this,enum_descriptor);
  MessageLite::SerializeAsString_abi_cxx11_(&local_b0,*(MessageLite **)(enum_descriptor + 0x20));
  OptionsValue(&local_70,this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar2 != 0) {
    io::Printer::Print<char[11],std::__cxx11::string,char[17],std::__cxx11::string>
              (this->printer_,
               "$descriptor$._options = None\n$descriptor$._serialized_options = $serialized_value$\n"
               ,(char (*) [11])0x4488a1,&local_50,(char (*) [17])"serialized_value",&local_70);
  }
  if (0 < *(int *)(enum_descriptor + 4)) {
    lVar4 = 0x18;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(enum_descriptor + 0x28);
      MessageLite::SerializeAsString_abi_cxx11_(&local_90,*(MessageLite **)(lVar1 + lVar4));
      OptionsValue(&local_b0,this,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar2 != 0) {
        StringPrintf_abi_cxx11_
                  (&local_90,"%s.values_by_name[\"%s\"]",local_50._M_dataplus._M_p,
                   **(undefined8 **)(lVar1 + -0x10 + lVar4));
        io::Printer::Print<char[11],std::__cxx11::string,char[17],std::__cxx11::string>
                  (this->printer_,
                   "$descriptor$._options = None\n$descriptor$._serialized_options = $serialized_value$\n"
                   ,(char (*) [11])0x4488a1,&local_90,(char (*) [17])"serialized_value",&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < *(int *)(enum_descriptor + 4));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::FixOptionsForEnum(const EnumDescriptor& enum_descriptor) const {
  std::string descriptor_name = ModuleLevelDescriptorName(enum_descriptor);
  std::string enum_options =
      OptionsValue(enum_descriptor.options().SerializeAsString());
  if (enum_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, enum_options, printer_);
  }
  for (int i = 0; i < enum_descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(i);
    std::string value_options =
        OptionsValue(value_descriptor.options().SerializeAsString());
    if (value_options != "None") {
      PrintDescriptorOptionsFixingCode(
          StringPrintf("%s.values_by_name[\"%s\"]", descriptor_name.c_str(),
                       value_descriptor.name().c_str()),
          value_options, printer_);
    }
  }
}